

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *poVar2;
  undefined1 local_280 [8];
  RayTracer tracer;
  allocator local_149;
  string local_148 [32];
  RayTracerConfig local_128;
  undefined1 local_98 [8];
  RayTracerConfig config;
  char **argv_local;
  int argc_local;
  
  config.triangles.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  RayTracerConfig::RayTracerConfig((RayTracerConfig *)local_98);
  if (argc < 2) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Using default config");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    RayTracerConfig::defaultConfig();
    RayTracerConfig::operator=((RayTracerConfig *)local_98,(RayTracerConfig *)&tracer.threadNumber);
    RayTracerConfig::~RayTracerConfig((RayTracerConfig *)&tracer.threadNumber);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Reading config from file ");
    poVar2 = std::operator<<(poVar2,*(char **)&((config.triangles.
                                                 super__Vector_base<Triangle,_std::allocator<Triangle>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                               ->x).z);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pcVar1 = *(char **)&((config.triangles.super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage)->x).z;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,pcVar1,&local_149);
    RayTracerConfig::fromFile(&local_128,(string *)local_148);
    RayTracerConfig::operator=((RayTracerConfig *)local_98,&local_128);
    RayTracerConfig::~RayTracerConfig(&local_128);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
  }
  operator<<((ostream *)&std::cerr,(RayTracerConfig *)local_98);
  RayTracer::RayTracer((RayTracer *)local_280,(RayTracerConfig *)local_98);
  RayTracer::processPixels((RayTracer *)local_280);
  RayTracerBase::printBitmap((RayTracerBase *)local_280,(ostream *)&std::cout);
  RayTracer::~RayTracer((RayTracer *)local_280);
  RayTracerConfig::~RayTracerConfig((RayTracerConfig *)local_98);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  RayTracerConfig config;
  if (argc > 1)
  {
    std::cerr << "Reading config from file " << argv[1] << std::endl;
    config = RayTracerConfig::fromFile(argv[1]);
  }
  else
  {
    std::cerr << "Using default config" << std::endl;
    config = RayTracerConfig::defaultConfig();
  }
  std::cerr << config;

  RayTracer tracer(config);
  tracer.processPixels();
  tracer.printBitmap(std::cout);
}